

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt_test.cc
# Opt level: O2

bool GetUint64(FileTest *t,uint64_t *out,char *name)

{
  bool bVar1;
  ulonglong uVar2;
  allocator<char> local_59;
  char *endptr;
  string str;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&endptr,name,&local_59);
  bVar1 = FileTest::GetAttribute(t,&str,(string *)&endptr);
  std::__cxx11::string::~string((string *)&endptr);
  if (bVar1) {
    uVar2 = strtoull(str._M_dataplus._M_p,&endptr,10);
    *out = uVar2;
    if (str._M_string_length != 0) {
      bVar1 = *endptr == '\0';
      goto LAB_0025ef11;
    }
  }
  bVar1 = false;
LAB_0025ef11:
  std::__cxx11::string::~string((string *)&str);
  return bVar1;
}

Assistant:

static bool GetUint64(FileTest *t, uint64_t *out, const char *name) {
  std::string str;
  if (!t->GetAttribute(&str, name)) {
    return false;
  }

  char *endptr;
  *out = strtoull(str.data(), &endptr, 10);
  return !str.empty() && *endptr == '\0';
}